

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O2

void __thiscall ProblemTest_InvalidObjIndex_Test::TestBody(ProblemTest_InvalidObjIndex_Test *this)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  AssertHelper local_3b0;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  Problem p;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&p);
  iVar1 = 3;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    mp::BasicProblem<mp::BasicProblemParams<int>_>::AddObj(&p,MIN,0);
  }
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"invalid index",(allocator<char> *)&local_3b0);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      mp::BasicProblem<mp::BasicProblemParams<int>_>::obj(&p,-1);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [95])
               "Expected: p.obj(-1) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_3b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",0xf0
             ,pcVar2);
  testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_3b0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"invalid index",(allocator<char> *)&local_3b0);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      mp::BasicProblem<mp::BasicProblemParams<int>_>::obj(&p,3);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [101])
               "Expected: p.obj(num_objs) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_3b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",0xf1
             ,pcVar2);
  testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_3b0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&p);
  return;
}

Assistant:

TEST(ProblemTest, InvalidObjIndex) {
  Problem p;
  const int num_objs = 3;
  for (int i = 0; i < num_objs; ++i)
    p.AddObj(mp::obj::MIN);
  EXPECT_ASSERT(p.obj(-1), "invalid index");
  EXPECT_ASSERT(p.obj(num_objs), "invalid index");
}